

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O1

int Fra_ClassesRefine(Fra_Cla_t *p)

{
  uint uVar1;
  long *plVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  int iVar7;
  long lVar8;
  
  p->vClassesTemp->nSize = 0;
  pVVar5 = p->vClasses;
  if (pVVar5->nSize < 1) {
    iVar7 = 0;
  }
  else {
    lVar8 = 0;
    iVar7 = 0;
    do {
      plVar2 = (long *)pVVar5->pArray[lVar8];
      if (*plVar2 == 0) {
        __assert_fail("pClass[0] != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                      ,0x1f8,"int Fra_ClassesRefine(Fra_Cla_t *)");
      }
      pVVar5 = p->vClassesTemp;
      uVar1 = pVVar5->nCap;
      if (pVVar5->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
          }
          pVVar5->pArray = ppvVar6;
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar1 * 2;
          if (iVar4 <= (int)uVar1) goto LAB_005f132b;
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
          }
          pVVar5->pArray = ppvVar6;
        }
        pVVar5->nCap = iVar4;
      }
LAB_005f132b:
      iVar4 = pVVar5->nSize;
      pVVar5->nSize = iVar4 + 1;
      pVVar5->pArray[iVar4] = plVar2;
      iVar4 = Fra_RefineClassLastIter(p,p->vClassesTemp);
      iVar7 = iVar7 + iVar4;
      lVar8 = lVar8 + 1;
      pVVar5 = p->vClasses;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar3 = p->vClassesTemp;
  p->vClassesTemp = pVVar5;
  p->vClasses = pVVar3;
  return iVar7;
}

Assistant:

int Fra_ClassesRefine( Fra_Cla_t * p )
{
    Vec_Ptr_t * vTemp;
    Aig_Obj_t ** pClass;
    int i, nRefis;
    // refine the classes
    nRefis = 0;
    Vec_PtrClear( p->vClassesTemp );
    Vec_PtrForEachEntry( Aig_Obj_t **, p->vClasses, pClass, i )
    {
        // add the class to the new array
        assert( pClass[0] != NULL );
        Vec_PtrPush( p->vClassesTemp, pClass );
        // refine the class iteratively
        nRefis += Fra_RefineClassLastIter( p, p->vClassesTemp );
    }
    // exchange the class representation
    vTemp = p->vClassesTemp;
    p->vClassesTemp = p->vClasses;
    p->vClasses = vTemp;
    return nRefis;
}